

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

Gia_Man_t * Gia_ManDupUnshuffleInputs(Gia_Man_t *p)

{
  char *pcVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  iVar4 = Gia_ManIsNormalized(p);
  if (iVar4 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  if (((p->nRegs < 1) || ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0)) ||
     (iVar4 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar4 < 1)) {
    __assert_fail("Gia_ManIsSeqWithBoxes(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd2,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  iVar4 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  iVar5 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
  if (iVar5 != p->vCis->nSize) {
    __assert_fail("nAll == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xde,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  uVar10 = iVar4 - p->nRegs;
  if ((int)uVar10 < 1) {
    __assert_fail("nPis > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xdf,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  uVar13 = (ulong)uVar10;
  uVar14 = 0;
  do {
    pGVar8 = Gia_ManAppendObj(p_00);
    uVar2 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
    *(ulong *)pGVar8 =
         uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p_00->pObjs;
    if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00232937;
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = p_00->pObjs;
    if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00232937;
    if ((long)p->vCis->nSize <= (long)uVar14) goto LAB_00232975;
    iVar4 = p->vCis->pArray[uVar14];
    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00232956;
    p->pObjs[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
    uVar14 = uVar14 + 1;
  } while (uVar13 != uVar14);
  if (0 < p->nRegs) {
    uVar11 = iVar5 - p->nRegs;
    uVar14 = (ulong)uVar11;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar2 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00232937;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00232937;
      if (((int)uVar11 < 0) || (p->vCis->nSize <= (int)uVar14)) goto LAB_00232975;
      iVar4 = p->vCis->pArray[uVar14];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00232956;
      p->pObjs[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < iVar5);
  }
  if ((int)uVar10 < iVar5 - p->nRegs) {
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_00232937:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00232937;
      if (p->vCis->nSize <= (int)uVar13) {
LAB_00232975:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p->vCis->pArray[uVar13];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00232956;
      p->pObjs[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar5 - p->nRegs);
  }
  puts("Warning: Unshuffled CI order to be correct AIG with boxes.");
  if (0 < p->nObjs) {
    lVar15 = 8;
    lVar12 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar10 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar11 = *(uint *)((long)pGVar3 +
                              lVar15 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar11 < 0)) goto LAB_00232994;
        iVar4 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar13 >> 0x1d) & 1,
                                 uVar11 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar4;
      }
      lVar12 = lVar12 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00232956:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar4;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_00232994:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar10;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  iVar4 = Gia_ManIsNormalized(p_00);
  if (iVar4 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xf1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManDupRemapEquiv(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupUnshuffleInputs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nCIs, nAll, nPis;
    // sanity checks
    assert( Gia_ManIsNormalized(p) );
    assert( Gia_ManIsSeqWithBoxes(p) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    // change input order
    // desired reorder:   PIs + NewCIs + FOs
    // current CI order:  PIs + FOs + NewCIs
    nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
    nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
    nPis = nCIs - Gia_ManRegNum(p);
    assert( nAll == Gia_ManCiNum(p) );
    assert( nPis > 0 );
    // copy PIs first
    for ( i = 0; i < nPis; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy flops second
    for ( i = nAll - Gia_ManRegNum(p); i < nAll; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy new CIs last
    for ( i = nPis; i < nAll - Gia_ManRegNum(p); i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    printf( "Warning: Unshuffled CI order to be correct AIG with boxes.\n" );
    // other things
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}